

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

point3f tinyusdz::vnormalize(point3f *a,float eps)

{
  point3f pVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_3c;
  float len;
  float eps_local;
  point3f *a_local;
  
  fVar2 = vlength(a);
  local_3c = eps;
  if (eps < fVar2) {
    local_3c = fVar2;
  }
  fVar2 = value::point3f::operator[](a,0);
  fVar3 = value::point3f::operator[](a,1);
  fVar4 = value::point3f::operator[](a,2);
  pVar1.y = fVar3 / local_3c;
  pVar1.x = fVar2 / local_3c;
  pVar1.z = fVar4 / local_3c;
  return pVar1;
}

Assistant:

value::point3f vnormalize(const value::point3f &a, const float eps) {
  float len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::point3f({a[0] / len, a[1] / len, a[2] / len});
}